

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void lambert_textured_lighting(vec3f light_dir,Model *model,TGAImage *image)

{
  double *pdVar1;
  array<vec<3UL,_int>,_3UL> pts;
  vec3f v;
  array<vec<2UL,_double>,_3UL> uvs;
  ulong y;
  size_t sVar2;
  reference pvVar3;
  reference pvVar4;
  reference pvVar5;
  reference pvVar6;
  reference pvVar7;
  double dVar8;
  vec3i vVar9;
  vec2f vVar10;
  double in_stack_fffffffffffffcd0;
  allocator<char> local_269;
  string local_268;
  TGAColor local_245;
  ulong local_240;
  size_t w;
  size_t h;
  TGAImage depth;
  double intensity;
  vec<3UL,_double> local_188;
  undefined1 local_170 [8];
  vec3f n;
  vec3f local_148;
  vec3i local_130;
  vec3f local_120;
  value_type local_108;
  int local_fc;
  undefined1 auStack_f8 [4];
  int j;
  array<vec<2UL,_double>,_3UL> uv_coords;
  array<vec<3UL,_double>,_3UL> world_coords;
  undefined4 uStack_78;
  array<vec<3UL,_int>,_3UL> screen_coords;
  size_t i;
  allocator<double> local_39;
  double local_38;
  undefined1 local_30 [8];
  vector<double,_std::allocator<double>_> zbuffer;
  TGAImage *image_local;
  Model *model_local;
  
  zbuffer.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)image;
  local_38 = std::numeric_limits<double>::max();
  local_38 = -local_38;
  std::allocator<double>::allocator(&local_39);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_30,360000,&local_38,&local_39);
  std::allocator<double>::~allocator(&local_39);
  screen_coords._M_elems[2].y = 0;
  screen_coords._M_elems[2].z = 0;
  while( true ) {
    sVar2 = Model::nfaces(model);
    if (sVar2 <= (ulong)screen_coords._M_elems[2]._4_8_) break;
    std::array<vec<3UL,_int>,_3UL>::array
              ((array<vec<3UL,_int>,_3UL> *)((long)&world_coords._M_elems[2].z + 4));
    std::array<vec<3UL,_double>,_3UL>::array
              ((array<vec<3UL,_double>,_3UL> *)&uv_coords._M_elems[2].y);
    std::array<vec<2UL,_double>,_3UL>::array((array<vec<2UL,_double>,_3UL> *)auStack_f8);
    for (local_fc = 0; local_fc < 3; local_fc = local_fc + 1) {
      Model::vert(&local_120,model,screen_coords._M_elems[2]._4_8_,(long)local_fc);
      v.y = local_120.z;
      v.x = local_120.y;
      v.z = in_stack_fffffffffffffcd0;
      vVar9 = world2screen(v);
      local_130 = vVar9;
      local_108 = vVar9;
      pvVar3 = std::array<vec<3UL,_int>,_3UL>::operator[]
                         ((array<vec<3UL,_int>,_3UL> *)((long)&world_coords._M_elems[2].z + 4),
                          (long)local_fc);
      *pvVar3 = local_108;
      Model::vert(&local_148,model,screen_coords._M_elems[2]._4_8_,(long)local_fc);
      pvVar4 = std::array<vec<3UL,_double>,_3UL>::operator[]
                         ((array<vec<3UL,_double>,_3UL> *)&uv_coords._M_elems[2].y,(long)local_fc);
      pvVar4->z = local_148.z;
      pvVar4->x = local_148.x;
      pvVar4->y = local_148.y;
      vVar10 = Model::uv(model,screen_coords._M_elems[2]._4_8_,(long)local_fc);
      n.z = vVar10.x;
      pvVar5 = std::array<vec<2UL,_double>,_3UL>::operator[]
                         ((array<vec<2UL,_double>,_3UL> *)auStack_f8,(long)local_fc);
      pvVar5->x = n.z;
      pvVar5->y = vVar10.y;
    }
    pdVar1 = &uv_coords._M_elems[2].y;
    pvVar4 = std::array<vec<3UL,_double>,_3UL>::operator[]((array<vec<3UL,_double>,_3UL> *)pdVar1,2)
    ;
    pvVar6 = std::array<vec<3UL,_double>,_3UL>::operator[]((array<vec<3UL,_double>,_3UL> *)pdVar1,0)
    ;
    operator-(&local_188,pvVar4,pvVar6);
    pdVar1 = &uv_coords._M_elems[2].y;
    pvVar4 = std::array<vec<3UL,_double>,_3UL>::operator[]((array<vec<3UL,_double>,_3UL> *)pdVar1,1)
    ;
    pvVar6 = std::array<vec<3UL,_double>,_3UL>::operator[]((array<vec<3UL,_double>,_3UL> *)pdVar1,0)
    ;
    operator-((vec<3UL,_double> *)&intensity,pvVar4,pvVar6);
    cross((vec3f *)local_170,&local_188,(vec3f *)&intensity);
    vec<3UL,_double>::normalize((vec<3UL,_double> *)local_170);
    dVar8 = dot<3ul,double>((vec<3UL,_double> *)local_170,&light_dir);
    if (0.0 < dVar8) {
      depth._32_8_ = _auStack_f8;
      pts._M_elems._8_8_ = screen_coords._M_elems[0]._0_8_;
      pts._M_elems[0].x = world_coords._M_elems[2].z._4_4_;
      pts._M_elems[0].y = uStack_78;
      pts._M_elems[1]._4_8_ = screen_coords._M_elems._8_8_;
      pts._M_elems[2]._0_8_ = screen_coords._M_elems[1]._4_8_;
      pts._M_elems[2].z = screen_coords._M_elems[2].x;
      uvs._M_elems[0].y = uv_coords._M_elems[0].x;
      uvs._M_elems[0].x = _auStack_f8;
      uvs._M_elems[1].x = uv_coords._M_elems[0].y;
      uvs._M_elems[1].y = uv_coords._M_elems[1].x;
      uvs._M_elems[2].x = uv_coords._M_elems[1].y;
      uvs._M_elems[2].y = uv_coords._M_elems[2].x;
      in_stack_fffffffffffffcd0 = (double)screen_coords._M_elems[1]._4_8_;
      triangle_textured(pts,uvs,(vector<double,_std::allocator<double>_> *)local_30,
                        (TGAImage *)
                        zbuffer.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,model);
    }
    screen_coords._M_elems[2]._4_8_ = screen_coords._M_elems[2]._4_8_ + 1;
  }
  TGAImage::TGAImage((TGAImage *)&h,600,600,1);
  for (w = 0; w < 600; w = w + 1) {
    for (local_240 = 0; sVar2 = w, y = local_240, local_240 < 600; local_240 = local_240 + 1) {
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)local_30,local_240 * 600 + w);
      TGAColor::TGAColor(&local_245,(uint8_t)(int)((*pvVar7 + 1.0) * 128.0));
      TGAImage::set((TGAImage *)&h,sVar2,y,&local_245);
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_268,"depth.tga",&local_269);
  TGAImage::write_tga_file((TGAImage *)&h,&local_268,true,true);
  std::__cxx11::string::~string((string *)&local_268);
  std::allocator<char>::~allocator(&local_269);
  TGAImage::~TGAImage((TGAImage *)&h);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_30);
  return;
}

Assistant:

void lambert_textured_lighting(vec3f light_dir, Model &model, TGAImage &image)
{
    std::vector<double> zbuffer(width * height, -std::numeric_limits<double>::max());
    for (size_t i = 0; i < model.nfaces(); i++) {
        std::array<vec3i, 3> screen_coords;
        std::array<vec3f, 3> world_coords;
        std::array<vec2f, 3> uv_coords;
        for (int j = 0; j < 3; j++) {
            screen_coords[j] = world2screen(model.vert(i, j));
            world_coords[j] = model.vert(i, j);
            uv_coords[j] = model.uv(i, j);
        }
        vec3f n = cross(world_coords[2] - world_coords[0], world_coords[1] - world_coords[0]);
        n.normalize();
        double intensity = dot(n, light_dir);

        if (intensity > 0) {
            triangle_textured(screen_coords, uv_coords, zbuffer, image, model);
        }
    }
    TGAImage depth(width, height, TGAImage::GRAYSCALE);
    for (size_t h = 0; h < height; h++)
        for (size_t w = 0; w < width; w++)
            depth.set(h, w, static_cast<uint8_t>((zbuffer[w * height + h] + 1) * 128));

    depth.write_tga_file("depth.tga");
}